

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join.h
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ezy::
join<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,char_const(&)[2]>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,ezy *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *range,char (*separator) [2])

{
  long *plVar1;
  long *plVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  anon_class_16_2_e8cc7173 __f;
  
  plVar1 = *(long **)this;
  plVar2 = *(long **)(this + 8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (plVar1 == plVar2) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar1,plVar1[1] + *plVar1);
    __f.separator =
         (char  [2])
         *(undefined2 *)
          &(range->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    __f.result = __return_storage_ptr__;
    __f._10_6_ = 0;
    std::
    for_each<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,ezy::join<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,char_const(&)[2]>(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,char_const(&)[2])::_lambda(auto:1_const&)_1_>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(long *)this + 0x20),
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(this + 8),__f
              );
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr ReturnType join(Range&& range, Separator&& separator = Separator{})
  {
    using std::begin;
    using std::end;
    if (ezy::empty(range))
    {
      return ReturnType{};
    }
    else
    {
      ReturnType result{*begin(range)};
      std::for_each(
          std::next(begin(range)),
          end(range),
          [&result,separator](const auto& e)
          {
            result += separator;
            result += e;
          }
        );
      return result;
    }
  }